

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O1

void __thiscall tcu::DebugOutStreambuf::flushLine(DebugOutStreambuf *this)

{
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::stringbuf::str();
  qpPrint((char *)local_30[0]);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"");
  std::__cxx11::stringbuf::str((string *)&this->field_0x48);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void DebugOutStreambuf::flushLine (void)
{
	qpPrint(m_curLine.str().c_str());
	m_curLine.str("");
}